

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O1

string * __thiscall
flatbuffers::jsons::(anonymous_namespace)::GenType_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,BaseType type)

{
  long lVar1;
  undefined8 *puVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  ulong *puVar6;
  char *pcVar7;
  char *pcVar8;
  undefined8 uVar9;
  string local_98;
  string local_78;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string local_38;
  
  switch((int)this) {
  case 2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "\"type\" : \"boolean\"";
    pcVar7 = "";
    goto LAB_002d7c58;
  case 3:
    NumToString<int>(&local_38,-0x80);
    puVar2 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x3828dd);
    local_58 = &local_48;
    plVar3 = puVar2 + 2;
    if ((long *)*puVar2 == plVar3) {
      local_48 = *plVar3;
      lStack_40 = puVar2[3];
    }
    else {
      local_48 = *plVar3;
      local_58 = (long *)*puVar2;
    }
    local_50 = puVar2[1];
    *puVar2 = plVar3;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    puVar2 = (undefined8 *)std::__cxx11::string::append((char *)&local_58);
    puVar6 = puVar2 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_98.field_2._M_allocated_capacity = *puVar6;
      local_98.field_2._8_8_ = puVar2[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *puVar6;
      local_98._M_dataplus._M_p = (pointer)*puVar2;
    }
    local_98._M_string_length = puVar2[1];
    *puVar2 = puVar6;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    NumToString<int>(&local_78,0x7f);
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar9 = local_98.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_78._M_string_length + local_98._M_string_length) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        uVar9 = local_78.field_2._M_allocated_capacity;
      }
      if (local_78._M_string_length + local_98._M_string_length <= (ulong)uVar9) {
        puVar2 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_78,0,(char *)0x0,(ulong)local_98._M_dataplus._M_p);
        break;
      }
    }
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_78._M_dataplus._M_p);
    break;
  case 4:
    NumToString<int>(&local_98,0xff);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x3828fe);
    goto LAB_002d7d6a;
  case 5:
    NumToString<short>(&local_38,-0x8000);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x3828dd);
    local_58 = &local_48;
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_48 = *plVar4;
      lStack_40 = plVar3[3];
    }
    else {
      local_48 = *plVar4;
      local_58 = (long *)*plVar3;
    }
    local_50 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_58);
    puVar6 = (ulong *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_98.field_2._M_allocated_capacity = *puVar6;
      local_98.field_2._8_8_ = plVar3[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *puVar6;
      local_98._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_98._M_string_length = plVar3[1];
    *plVar3 = (long)puVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    NumToString<short>(&local_78,0x7fff);
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar9 = local_98.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_78._M_string_length + local_98._M_string_length) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        uVar9 = local_78.field_2._M_allocated_capacity;
      }
      if (local_78._M_string_length + local_98._M_string_length <= (ulong)uVar9) {
        puVar2 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_78,0,(char *)0x0,(ulong)local_98._M_dataplus._M_p);
        break;
      }
    }
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_78._M_dataplus._M_p);
    break;
  case 6:
    NumToString<unsigned_short>(&local_98,0xffff);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x38292d);
    goto LAB_002d7d6a;
  case 7:
    NumToString<int>(&local_38,-0x80000000);
    puVar2 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x3828dd);
    local_58 = &local_48;
    plVar3 = puVar2 + 2;
    if ((long *)*puVar2 == plVar3) {
      local_48 = *plVar3;
      lStack_40 = puVar2[3];
    }
    else {
      local_48 = *plVar3;
      local_58 = (long *)*puVar2;
    }
    local_50 = puVar2[1];
    *puVar2 = plVar3;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    puVar2 = (undefined8 *)std::__cxx11::string::append((char *)&local_58);
    puVar6 = puVar2 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_98.field_2._M_allocated_capacity = *puVar6;
      local_98.field_2._8_8_ = puVar2[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *puVar6;
      local_98._M_dataplus._M_p = (pointer)*puVar2;
    }
    local_98._M_string_length = puVar2[1];
    *puVar2 = puVar6;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    NumToString<int>(&local_78,0x7fffffff);
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar9 = local_98.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_78._M_string_length + local_98._M_string_length) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        uVar9 = local_78.field_2._M_allocated_capacity;
      }
      if (local_78._M_string_length + local_98._M_string_length <= (ulong)uVar9) {
        puVar2 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_78,0,(char *)0x0,(ulong)local_98._M_dataplus._M_p);
        break;
      }
    }
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_78._M_dataplus._M_p);
    break;
  case 8:
    NumToString<unsigned_int>(&local_98,0xffffffff);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x38292d);
    goto LAB_002d7d6a;
  case 9:
    NumToString<long>(&local_38,-0x8000000000000000);
    puVar2 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x3828dd);
    local_58 = &local_48;
    plVar3 = puVar2 + 2;
    if ((long *)*puVar2 == plVar3) {
      local_48 = *plVar3;
      lStack_40 = puVar2[3];
    }
    else {
      local_48 = *plVar3;
      local_58 = (long *)*puVar2;
    }
    local_50 = puVar2[1];
    *puVar2 = plVar3;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    puVar2 = (undefined8 *)std::__cxx11::string::append((char *)&local_58);
    puVar6 = puVar2 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_98.field_2._M_allocated_capacity = *puVar6;
      local_98.field_2._8_8_ = puVar2[3];
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *puVar6;
      local_98._M_dataplus._M_p = (pointer)*puVar2;
    }
    local_98._M_string_length = puVar2[1];
    *puVar2 = puVar6;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    NumToString<long>(&local_78,0x7fffffffffffffff);
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar9 = local_98.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar9 < local_78._M_string_length + local_98._M_string_length) {
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        uVar9 = local_78.field_2._M_allocated_capacity;
      }
      if (local_78._M_string_length + local_98._M_string_length <= (ulong)uVar9) {
        puVar2 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_78,0,(char *)0x0,(ulong)local_98._M_dataplus._M_p);
        break;
      }
    }
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_78._M_dataplus._M_p);
    break;
  case 10:
    NumToString<unsigned_long>(&local_98,0xffffffffffffffff);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x38292d);
LAB_002d7d6a:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar5) {
      lVar1 = plVar3[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    local_38.field_2._M_allocated_capacity = local_98.field_2._M_allocated_capacity;
    local_38._M_dataplus._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_002d8236;
  case 0xb:
  case 0xc:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "\"type\" : \"number\"";
    pcVar7 = "";
    goto LAB_002d7c58;
  case 0xd:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = "\"type\" : \"string\"";
    pcVar7 = "";
    goto LAB_002d7c58;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "";
    pcVar8 = pcVar7;
LAB_002d7c58:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar8,pcVar7);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = puVar2 + 2;
  if ((size_type *)*puVar2 == psVar5) {
    uVar9 = puVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar9;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = puVar2[1];
  *puVar2 = psVar5;
  puVar2[1] = 0;
  *(undefined1 *)psVar5 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == &local_38.field_2) {
    return __return_storage_ptr__;
  }
LAB_002d8236:
  operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

static std::string GenType(BaseType type) {
  switch (type) {
    case BASE_TYPE_BOOL: return "\"type\" : \"boolean\"";
    case BASE_TYPE_CHAR:
      return "\"type\" : \"integer\", \"minimum\" : " +
             NumToString(std::numeric_limits<int8_t>::min()) +
             ", \"maximum\" : " +
             NumToString(std::numeric_limits<int8_t>::max());
    case BASE_TYPE_UCHAR:
      return "\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" :" +
             NumToString(std::numeric_limits<uint8_t>::max());
    case BASE_TYPE_SHORT:
      return "\"type\" : \"integer\", \"minimum\" : " +
             NumToString(std::numeric_limits<int16_t>::min()) +
             ", \"maximum\" : " +
             NumToString(std::numeric_limits<int16_t>::max());
    case BASE_TYPE_USHORT:
      return "\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" : " +
             NumToString(std::numeric_limits<uint16_t>::max());
    case BASE_TYPE_INT:
      return "\"type\" : \"integer\", \"minimum\" : " +
             NumToString(std::numeric_limits<int32_t>::min()) +
             ", \"maximum\" : " +
             NumToString(std::numeric_limits<int32_t>::max());
    case BASE_TYPE_UINT:
      return "\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" : " +
             NumToString(std::numeric_limits<uint32_t>::max());
    case BASE_TYPE_LONG:
      return "\"type\" : \"integer\", \"minimum\" : " +
             NumToString(std::numeric_limits<int64_t>::min()) +
             ", \"maximum\" : " +
             NumToString(std::numeric_limits<int64_t>::max());
    case BASE_TYPE_ULONG:
      return "\"type\" : \"integer\", \"minimum\" : 0, \"maximum\" : " +
             NumToString(std::numeric_limits<uint64_t>::max());
    case BASE_TYPE_FLOAT:
    case BASE_TYPE_DOUBLE: return "\"type\" : \"number\"";
    case BASE_TYPE_STRING: return "\"type\" : \"string\"";
    default: return "";
  }
}